

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall
btSoftBody::appendAngularJoint(btSoftBody *this,Specs *specs,Cluster *body0,Body body1)

{
  undefined8 uVar1;
  Joint *pJVar2;
  btTransform *pbVar3;
  btVector3 bVar4;
  btTransform local_70;
  
  pJVar2 = (Joint *)btAlignedAllocInternal(0xe0,0x10);
  memset(pJVar2->m_refs,0,0xa8);
  pJVar2->_vptr_Joint = (_func_int **)&PTR__Joint_001f24b8;
  pJVar2->m_bodies[0].m_soft = body0;
  *(btRigidBody **)((long)pJVar2->m_bodies + 8) = (btRigidBody *)0x0;
  *(btCollisionObject **)((long)pJVar2->m_bodies + 0x10) = (btCollisionObject *)0x0;
  ((Body *)((long)pJVar2->m_bodies + 0x18))->m_soft = body1.m_soft;
  *(btRigidBody **)((long)pJVar2->m_bodies + 0x20) = body1.m_rigid;
  *(btCollisionObject **)((long)pJVar2->m_bodies + 0x28) = body1.m_collisionObject;
  pbVar3 = Body::xform(pJVar2->m_bodies);
  btTransform::inverse(&local_70,pbVar3);
  bVar4 = operator*(&local_70.m_basis,(btVector3 *)(specs + 0xc));
  *&pJVar2->m_refs[0].m_floats = bVar4.m_floats;
  pbVar3 = Body::xform((Body *)((long)pJVar2->m_bodies + 0x18));
  btTransform::inverse(&local_70,pbVar3);
  bVar4 = operator*(&local_70.m_basis,(btVector3 *)(specs + 0xc));
  *&((btVector3 *)((long)pJVar2->m_refs + 0x10))->m_floats = bVar4.m_floats;
  uVar1 = *(undefined8 *)specs;
  pJVar2->m_cfm = (btScalar)(int)((ulong)uVar1 >> 0x20);
  pJVar2->m_erp = (btScalar)(int)uVar1;
  pJVar2->m_split = *(btScalar *)(specs + 8);
  *(undefined8 *)((long)(pJVar2 + 1) + 0x20) = *(undefined8 *)(specs + 0x20);
  local_70.m_basis.m_el[0].m_floats._0_8_ = pJVar2;
  btAlignedObjectArray<btSoftBody::Joint_*>::push_back(&this->m_joints,(Joint **)&local_70);
  return;
}

Assistant:

void			btSoftBody::appendAngularJoint(const AJoint::Specs& specs,Cluster* body0,Body body1)
{
	AJoint*		pj	=	new(btAlignedAlloc(sizeof(AJoint),16)) AJoint();
	pj->m_bodies[0]	=	body0;
	pj->m_bodies[1]	=	body1;
	pj->m_refs[0]	=	pj->m_bodies[0].xform().inverse().getBasis()*specs.axis;
	pj->m_refs[1]	=	pj->m_bodies[1].xform().inverse().getBasis()*specs.axis;
	pj->m_cfm		=	specs.cfm;
	pj->m_erp		=	specs.erp;
	pj->m_split		=	specs.split;
	pj->m_icontrol	=	specs.icontrol;
	m_joints.push_back(pj);
}